

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->Repositories).
                super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->Repositories; p_Var1 = p_Var1->_M_next) {
    LoadRevisions(this,(SVNInfo *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void cmCTestSVN::LoadRevisions()
{
  // Get revisions for all the external repositories
  std::list<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::list<SVNInfo>::iterator itend = this->Repositories.end();
  for( ; itbeg != itend ; itbeg++)
    {
    SVNInfo& svninfo = *itbeg;
    LoadRevisions(svninfo);
    }
}